

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

PatternList *
parse_expr(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  int iVar4;
  string *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  PatternList *extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  PatternList local_d8;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_b8;
  PatternList local_98;
  PatternList local_78;
  PatternList *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  parse_seq(&local_d8,tokens,options);
  psVar5 = Tokens::current_abi_cxx11_(tokens);
  iVar4 = std::__cxx11::string::compare((char *)psVar5);
  if (iVar4 == 0) {
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    maybe_collapse_to_required(&local_78);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Pattern>>
              ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)&local_b8,(shared_ptr<docopt::Pattern> *)&local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    while( true ) {
      psVar5 = Tokens::current_abi_cxx11_(tokens);
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 != 0) break;
      Tokens::pop_abi_cxx11_(&local_50,tokens);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      parse_seq(&local_98,tokens,options);
      local_78.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_d8.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_d8.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_78.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_d8.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_98.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_78);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_98);
      maybe_collapse_to_required(&local_78);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)&local_b8,(shared_ptr<docopt::Pattern> *)&local_78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((long)local_b8.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((local_b8.
                      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((local_b8.
                      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                    _M_pi;
      ((local_b8.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((local_b8.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    }
    else {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      psVar3 = local_b8.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      psVar2 = local_b8.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar1 = local_b8.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014f8d8;
      local_b8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(pointer *)&p_Var6[1]._M_use_count = psVar1;
      p_Var6[2]._vptr__Sp_counted_base = (_func_int **)psVar2;
      *(pointer *)&p_Var6[2]._M_use_count = psVar3;
      local_78.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR_flat_0014f250;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_78);
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var6 + 1);
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6;
    }
    __l._M_len = 1;
    __l._M_array = (iterator)&local_98;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(local_58,__l,(allocator_type *)&local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_98.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(&local_b8);
  }
  else {
    (local_58->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_d8.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_58->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_d8.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_58->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_d8.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_d8);
  return extraout_RAX;
}

Assistant:

PatternList parse_expr(Tokens& tokens, std::vector<Option>& options)
{
	// expr ::= seq ( '|' seq )* ;

	auto seq = parse_seq(tokens, options);

	if (tokens.current() != "|")
		return seq;

	PatternList ret;
	ret.emplace_back(maybe_collapse_to_required(std::move(seq)));

	while (tokens.current() == "|") {
		tokens.pop();
		seq = parse_seq(tokens, options);
		ret.emplace_back(maybe_collapse_to_required(std::move(seq)));
	}

	return { maybe_collapse_to_either(std::move(ret)) };
}